

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equipartitionTest.cpp
# Opt level: O1

void __thiscall OpenMD::Equipartition::doFrame(Equipartition *this,int param_1)

{
  SelectionManager *this_00;
  double *pdVar1;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  uint i_2;
  StuntDouble *pSVar4;
  uint i_1;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  int i;
  Vector3d angMom_Temp;
  Vector3d linMom_Temp;
  Mat3x3d momentInertia;
  int local_ec;
  value_type local_e8;
  value_type local_c8;
  double local_b0;
  SelectionSet local_a8;
  double local_88;
  double local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48 [4];
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_a8,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar6 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar6),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_a8.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar6));
      lVar6 = lVar6 + 0x28;
    } while (lVar6 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_a8.bitsets_);
  }
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  iVar5 = 0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_e8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_e8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_e8.super_Vector<double,_3U>.data_[1] = 0.0;
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  pSVar4 = SelectionManager::beginSelected(this_00,&local_ec);
  if (pSVar4 == (StuntDouble *)0x0) {
    dVar10 = 0.0;
  }
  else {
    do {
      lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
      local_48[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar6 + (long)pSVar4->localIndex_ * 0x18);
      local_48[0] = *pdVar1;
      local_48[1] = pdVar1[1];
      dVar10 = pSVar4->mass_;
      local_a8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar6 = 0;
      do {
        (&local_a8.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start)[lVar6] = (pointer)(local_48[lVar6] * dVar10);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      dVar10 = pSVar4->mass_ * 8.31451e-07;
      auVar7._0_8_ = (double)local_a8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start *
                     (double)local_a8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start;
      auVar7._8_8_ = (double)local_a8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish *
                     (double)local_a8.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
      auVar8._8_8_ = dVar10;
      auVar8._0_8_ = dVar10;
      auVar8 = divpd(auVar7,auVar8);
      local_c8.super_Vector<double,_3U>.data_[0] =
           auVar8._0_8_ + local_c8.super_Vector<double,_3U>.data_[0];
      local_c8.super_Vector<double,_3U>.data_[1] =
           auVar8._8_8_ + local_c8.super_Vector<double,_3U>.data_[1];
      local_c8.super_Vector<double,_3U>.data_[2] =
           ((double)local_a8.bitsets_.
                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage *
           (double)local_a8.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) / dVar10 +
           local_c8.super_Vector<double,_3U>.data_[2];
      if (pSVar4->objType_ - otDAtom < 2) {
        lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).angularMomentum.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
        local_b0 = *(double *)(lVar6 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
        puVar2 = (undefined4 *)(lVar6 + (long)pSVar4->localIndex_ * 0x18);
        local_58 = *puVar2;
        uStack_54 = puVar2[1];
        uStack_50 = puVar2[2];
        uStack_4c = puVar2[3];
        (*pSVar4->_vptr_StuntDouble[5])(&local_a8,pSVar4);
        auVar9._0_8_ = (double)CONCAT44(uStack_54,local_58) * (double)CONCAT44(uStack_54,local_58);
        auVar9._8_8_ = (double)CONCAT44(uStack_4c,uStack_50) * (double)CONCAT44(uStack_4c,uStack_50)
        ;
        auVar3._8_4_ = SUB84(local_88 * 8.31451e-07,0);
        auVar3._0_8_ = (double)local_a8.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start * 8.31451e-07;
        auVar3._12_4_ = (int)((ulong)(local_88 * 8.31451e-07) >> 0x20);
        auVar8 = divpd(auVar9,auVar3);
        local_e8.super_Vector<double,_3U>.data_[0] =
             auVar8._0_8_ + local_e8.super_Vector<double,_3U>.data_[0];
        local_e8.super_Vector<double,_3U>.data_[1] =
             auVar8._8_8_ + local_e8.super_Vector<double,_3U>.data_[1];
        local_e8.super_Vector<double,_3U>.data_[2] =
             (local_b0 * local_b0) / (local_68 * 8.31451e-07) +
             local_e8.super_Vector<double,_3U>.data_[2];
      }
      iVar5 = iVar5 + 1;
      pSVar4 = SelectionManager::nextSelected(this_00,&local_ec);
    } while (pSVar4 != (StuntDouble *)0x0);
    dVar10 = (double)iVar5;
  }
  lVar6 = 0;
  do {
    local_c8.super_Vector<double,_3U>.data_[lVar6] =
         local_c8.super_Vector<double,_3U>.data_[lVar6] / dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    local_e8.super_Vector<double,_3U>.data_[lVar6] =
         local_e8.super_Vector<double,_3U>.data_[lVar6] / dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->TempP_,&local_c8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
            (&this->TempJ_,&local_e8);
  return;
}

Assistant:

void Equipartition::doFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    const RealType kb = 8.31451e-7;
    Vector3d linMom_Temp;
    Vector3d angMom_Temp;
    int count = 0;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      count++;
      Vector3d linMom = sd->getVel() * sd->getMass();
      linMom_Temp[0] += linMom[0] * linMom[0] / (kb * sd->getMass());
      linMom_Temp[1] += linMom[1] * linMom[1] / (kb * sd->getMass());
      linMom_Temp[2] += linMom[2] * linMom[2] / (kb * sd->getMass());
      if (sd->isDirectional()) {
        Vector3d angMom       = sd->getJ();
        Mat3x3d momentInertia = sd->getI();
        angMom_Temp[0] += angMom[0] * angMom[0] / (kb * momentInertia(0, 0));
        angMom_Temp[1] += angMom[1] * angMom[1] / (kb * momentInertia(1, 1));
        angMom_Temp[2] += angMom[2] * angMom[2] / (kb * momentInertia(2, 2));
      }
    }

    linMom_Temp /= count;
    angMom_Temp /= count;
    TempP_.push_back(linMom_Temp);
    TempJ_.push_back(angMom_Temp);
  }